

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

int google::SafeFOpen(FILE **fp,char *fname,char *mode)

{
  int iVar1;
  FILE *pFVar2;
  int *piVar3;
  
  if (fp != (FILE **)0x0) {
    pFVar2 = fopen(fname,mode);
    *fp = (FILE *)pFVar2;
    iVar1 = 0;
    if (pFVar2 == (FILE *)0x0) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
    }
    return iVar1;
  }
  __assert_fail("fp != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/util.h"
                ,0x16a,"int google::SafeFOpen(FILE **, const char *, const char *)");
}

Assistant:

inline int SafeFOpen(FILE **fp, const char* fname, const char *mode)
{
#if defined(_MSC_VER) && _MSC_VER >= 1400
	return fopen_s(fp, fname, mode);
#else
	assert(fp != NULL);
	*fp = fopen(fname, mode);
    // errno only guaranteed to be set on failure
	return ((*fp == NULL) ? errno : 0);
#endif
}